

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_sse_blend_popcnt_unroll16(uint16_t *array,uint32_t len,uint32_t *flags)

{
  ulong uVar1;
  int *piVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  ulong uVar243;
  byte bVar244;
  byte bVar245;
  byte bVar246;
  byte bVar247;
  byte bVar248;
  byte bVar249;
  byte bVar250;
  byte bVar251;
  byte bVar252;
  byte bVar253;
  byte bVar254;
  byte bVar255;
  byte bVar256;
  byte bVar257;
  byte bVar258;
  byte bVar259;
  long lVar260;
  ulong uVar261;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  
  auVar262 = vmovdqa64_avx512vl(_DAT_00114060);
  auVar263 = vmovdqa64_avx512vl(_DAT_00114070);
  uVar243 = (ulong)(len >> 3);
  uVar261 = 0;
  while (uVar1 = uVar261 + 0x10, uVar1 <= uVar243) {
    auVar264 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x50));
    auVar265 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x60));
    auVar266 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x70));
    lVar260 = 0x20;
    auVar267 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8),auVar262,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 8));
    auVar268 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 8),auVar263,
                                 *(undefined1 (*) [16])(array + uVar261 * 8));
    auVar269 = vmovdqa64_avx512vl(auVar265);
    auVar270 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x10),auVar262,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x18));
    auVar271 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x18),auVar263,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x10));
    auVar272 = vmovdqa64_avx512vl(auVar266);
    auVar273 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x20),auVar262,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x28));
    auVar274 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x28),auVar263,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x20));
    auVar275 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x30),auVar262,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x38));
    auVar276 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x38),auVar263,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x30));
    auVar277 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x40),auVar262,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x48));
    auVar278 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x48),auVar263,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x40));
    auVar279 = vmovdqa64_avx512vl(auVar264);
    auVar279 = vpermt2b_avx512vl(auVar279,auVar262,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x58));
    auVar280 = vpermt2b_avx512vl(auVar269,auVar262,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x68));
    auVar272 = vpermt2b_avx512vl(auVar272,auVar262,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x78));
    auVar269 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x58),auVar263,
                                 auVar264);
    auVar264 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x68),auVar263,
                                 auVar265);
    auVar265 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x78),auVar263,
                                 auVar266);
    for (; uVar261 = uVar1, lVar260 != 0; lVar260 = lVar260 + -4) {
      auVar266 = auVar270 >> 7;
      auVar19 = auVar270 >> 0xf;
      auVar35 = auVar270 >> 0x17;
      auVar51 = auVar270 >> 0x1f;
      auVar67 = auVar270 >> 0x27;
      auVar83 = auVar270 >> 0x2f;
      auVar99 = auVar270 >> 0x37;
      auVar115 = auVar270 >> 0x3f;
      auVar131 = auVar270 >> 0x47;
      auVar147 = auVar270 >> 0x4f;
      auVar163 = auVar270 >> 0x57;
      auVar179 = auVar270 >> 0x5f;
      auVar195 = auVar270 >> 0x67;
      auVar211 = auVar270 >> 0x6f;
      auVar227 = auVar270 >> 0x77;
      bVar244 = auVar270[0xf];
      auVar4 = auVar273 >> 7;
      auVar20 = auVar273 >> 0xf;
      auVar36 = auVar273 >> 0x17;
      auVar52 = auVar273 >> 0x1f;
      auVar68 = auVar273 >> 0x27;
      auVar84 = auVar273 >> 0x2f;
      auVar100 = auVar273 >> 0x37;
      auVar116 = auVar273 >> 0x3f;
      auVar132 = auVar273 >> 0x47;
      auVar148 = auVar273 >> 0x4f;
      auVar164 = auVar273 >> 0x57;
      auVar180 = auVar273 >> 0x5f;
      auVar196 = auVar273 >> 0x67;
      auVar212 = auVar273 >> 0x6f;
      auVar228 = auVar273 >> 0x77;
      bVar245 = auVar273[0xf];
      auVar5 = auVar271 >> 7;
      auVar21 = auVar271 >> 0xf;
      auVar37 = auVar271 >> 0x17;
      auVar53 = auVar271 >> 0x1f;
      auVar69 = auVar271 >> 0x27;
      auVar85 = auVar271 >> 0x2f;
      auVar101 = auVar271 >> 0x37;
      auVar117 = auVar271 >> 0x3f;
      auVar133 = auVar271 >> 0x47;
      auVar149 = auVar271 >> 0x4f;
      auVar165 = auVar271 >> 0x57;
      auVar181 = auVar271 >> 0x5f;
      auVar197 = auVar271 >> 0x67;
      auVar213 = auVar271 >> 0x6f;
      auVar229 = auVar271 >> 0x77;
      bVar246 = auVar271[0xf];
      auVar6 = auVar267 >> 7;
      auVar22 = auVar267 >> 0xf;
      auVar38 = auVar267 >> 0x17;
      auVar54 = auVar267 >> 0x1f;
      auVar70 = auVar267 >> 0x27;
      auVar86 = auVar267 >> 0x2f;
      auVar102 = auVar267 >> 0x37;
      auVar118 = auVar267 >> 0x3f;
      auVar134 = auVar267 >> 0x47;
      auVar150 = auVar267 >> 0x4f;
      auVar166 = auVar267 >> 0x57;
      auVar182 = auVar267 >> 0x5f;
      auVar198 = auVar267 >> 0x67;
      auVar214 = auVar267 >> 0x6f;
      auVar230 = auVar267 >> 0x77;
      bVar247 = auVar267[0xf];
      auVar267 = vpaddb_avx(auVar267,auVar267);
      auVar270 = vpaddb_avx(auVar270,auVar270);
      auVar271 = vpaddb_avx(auVar271,auVar271);
      auVar273 = vpaddb_avx(auVar273,auVar273);
      auVar7 = auVar268 >> 7;
      auVar23 = auVar268 >> 0xf;
      auVar39 = auVar268 >> 0x17;
      auVar55 = auVar268 >> 0x1f;
      auVar71 = auVar268 >> 0x27;
      auVar87 = auVar268 >> 0x2f;
      auVar103 = auVar268 >> 0x37;
      auVar119 = auVar268 >> 0x3f;
      auVar135 = auVar268 >> 0x47;
      auVar151 = auVar268 >> 0x4f;
      auVar167 = auVar268 >> 0x57;
      auVar183 = auVar268 >> 0x5f;
      auVar199 = auVar268 >> 0x67;
      auVar215 = auVar268 >> 0x6f;
      auVar231 = auVar268 >> 0x77;
      bVar248 = auVar268[0xf];
      auVar268 = vpaddb_avx(auVar268,auVar268);
      auVar8 = auVar274 >> 7;
      auVar24 = auVar274 >> 0xf;
      auVar40 = auVar274 >> 0x17;
      auVar56 = auVar274 >> 0x1f;
      auVar72 = auVar274 >> 0x27;
      auVar88 = auVar274 >> 0x2f;
      auVar104 = auVar274 >> 0x37;
      auVar120 = auVar274 >> 0x3f;
      auVar136 = auVar274 >> 0x47;
      auVar152 = auVar274 >> 0x4f;
      auVar168 = auVar274 >> 0x57;
      auVar184 = auVar274 >> 0x5f;
      auVar200 = auVar274 >> 0x67;
      auVar216 = auVar274 >> 0x6f;
      auVar232 = auVar274 >> 0x77;
      bVar249 = auVar274[0xf];
      auVar274 = vpaddb_avx(auVar274,auVar274);
      auVar9 = auVar275 >> 7;
      auVar25 = auVar275 >> 0xf;
      auVar41 = auVar275 >> 0x17;
      auVar57 = auVar275 >> 0x1f;
      auVar73 = auVar275 >> 0x27;
      auVar89 = auVar275 >> 0x2f;
      auVar105 = auVar275 >> 0x37;
      auVar121 = auVar275 >> 0x3f;
      auVar137 = auVar275 >> 0x47;
      auVar153 = auVar275 >> 0x4f;
      auVar169 = auVar275 >> 0x57;
      auVar185 = auVar275 >> 0x5f;
      auVar201 = auVar275 >> 0x67;
      auVar217 = auVar275 >> 0x6f;
      auVar233 = auVar275 >> 0x77;
      bVar250 = auVar275[0xf];
      auVar275 = vpaddb_avx(auVar275,auVar275);
      auVar10 = auVar276 >> 7;
      auVar26 = auVar276 >> 0xf;
      auVar42 = auVar276 >> 0x17;
      auVar58 = auVar276 >> 0x1f;
      auVar74 = auVar276 >> 0x27;
      auVar90 = auVar276 >> 0x2f;
      auVar106 = auVar276 >> 0x37;
      auVar122 = auVar276 >> 0x3f;
      auVar138 = auVar276 >> 0x47;
      auVar154 = auVar276 >> 0x4f;
      auVar170 = auVar276 >> 0x57;
      auVar186 = auVar276 >> 0x5f;
      auVar202 = auVar276 >> 0x67;
      auVar218 = auVar276 >> 0x6f;
      auVar234 = auVar276 >> 0x77;
      bVar251 = auVar276[0xf];
      auVar276 = vpaddb_avx(auVar276,auVar276);
      auVar11 = auVar277 >> 7;
      auVar27 = auVar277 >> 0xf;
      auVar43 = auVar277 >> 0x17;
      auVar59 = auVar277 >> 0x1f;
      auVar75 = auVar277 >> 0x27;
      auVar91 = auVar277 >> 0x2f;
      auVar107 = auVar277 >> 0x37;
      auVar123 = auVar277 >> 0x3f;
      auVar139 = auVar277 >> 0x47;
      auVar155 = auVar277 >> 0x4f;
      auVar171 = auVar277 >> 0x57;
      auVar187 = auVar277 >> 0x5f;
      auVar203 = auVar277 >> 0x67;
      auVar219 = auVar277 >> 0x6f;
      auVar235 = auVar277 >> 0x77;
      bVar252 = auVar277[0xf];
      auVar277 = vpaddb_avx(auVar277,auVar277);
      auVar12 = auVar278 >> 7;
      auVar28 = auVar278 >> 0xf;
      auVar44 = auVar278 >> 0x17;
      auVar60 = auVar278 >> 0x1f;
      auVar76 = auVar278 >> 0x27;
      auVar92 = auVar278 >> 0x2f;
      auVar108 = auVar278 >> 0x37;
      auVar124 = auVar278 >> 0x3f;
      auVar140 = auVar278 >> 0x47;
      auVar156 = auVar278 >> 0x4f;
      auVar172 = auVar278 >> 0x57;
      auVar188 = auVar278 >> 0x5f;
      auVar204 = auVar278 >> 0x67;
      auVar220 = auVar278 >> 0x6f;
      auVar236 = auVar278 >> 0x77;
      bVar253 = auVar278[0xf];
      auVar278 = vpaddb_avx(auVar278,auVar278);
      auVar13 = auVar279 >> 7;
      auVar29 = auVar279 >> 0xf;
      auVar45 = auVar279 >> 0x17;
      auVar61 = auVar279 >> 0x1f;
      auVar77 = auVar279 >> 0x27;
      auVar93 = auVar279 >> 0x2f;
      auVar109 = auVar279 >> 0x37;
      auVar125 = auVar279 >> 0x3f;
      auVar141 = auVar279 >> 0x47;
      auVar157 = auVar279 >> 0x4f;
      auVar173 = auVar279 >> 0x57;
      auVar189 = auVar279 >> 0x5f;
      auVar205 = auVar279 >> 0x67;
      auVar221 = auVar279 >> 0x6f;
      auVar237 = auVar279 >> 0x77;
      bVar254 = auVar279[0xf];
      auVar279 = vpaddb_avx(auVar279,auVar279);
      auVar14 = auVar264 >> 7;
      auVar30 = auVar264 >> 0xf;
      auVar46 = auVar264 >> 0x17;
      auVar62 = auVar264 >> 0x1f;
      auVar78 = auVar264 >> 0x27;
      auVar94 = auVar264 >> 0x2f;
      auVar110 = auVar264 >> 0x37;
      auVar126 = auVar264 >> 0x3f;
      auVar142 = auVar264 >> 0x47;
      auVar158 = auVar264 >> 0x4f;
      auVar174 = auVar264 >> 0x57;
      auVar190 = auVar264 >> 0x5f;
      auVar206 = auVar264 >> 0x67;
      auVar222 = auVar264 >> 0x6f;
      auVar238 = auVar264 >> 0x77;
      bVar255 = auVar264[0xf];
      auVar264 = vpaddb_avx(auVar264,auVar264);
      auVar15 = auVar269 >> 7;
      auVar31 = auVar269 >> 0xf;
      auVar47 = auVar269 >> 0x17;
      auVar63 = auVar269 >> 0x1f;
      auVar79 = auVar269 >> 0x27;
      auVar95 = auVar269 >> 0x2f;
      auVar111 = auVar269 >> 0x37;
      auVar127 = auVar269 >> 0x3f;
      auVar143 = auVar269 >> 0x47;
      auVar159 = auVar269 >> 0x4f;
      auVar175 = auVar269 >> 0x57;
      auVar191 = auVar269 >> 0x5f;
      auVar207 = auVar269 >> 0x67;
      auVar223 = auVar269 >> 0x6f;
      auVar239 = auVar269 >> 0x77;
      bVar256 = auVar269[0xf];
      auVar269 = vpaddb_avx(auVar269,auVar269);
      auVar16 = auVar272 >> 7;
      auVar32 = auVar272 >> 0xf;
      auVar48 = auVar272 >> 0x17;
      auVar64 = auVar272 >> 0x1f;
      auVar80 = auVar272 >> 0x27;
      auVar96 = auVar272 >> 0x2f;
      auVar112 = auVar272 >> 0x37;
      auVar128 = auVar272 >> 0x3f;
      auVar144 = auVar272 >> 0x47;
      auVar160 = auVar272 >> 0x4f;
      auVar176 = auVar272 >> 0x57;
      auVar192 = auVar272 >> 0x5f;
      auVar208 = auVar272 >> 0x67;
      auVar224 = auVar272 >> 0x6f;
      auVar240 = auVar272 >> 0x77;
      bVar257 = auVar272[0xf];
      auVar272 = vpaddb_avx(auVar272,auVar272);
      auVar17 = auVar280 >> 7;
      auVar33 = auVar280 >> 0xf;
      auVar49 = auVar280 >> 0x17;
      auVar65 = auVar280 >> 0x1f;
      auVar81 = auVar280 >> 0x27;
      auVar97 = auVar280 >> 0x2f;
      auVar113 = auVar280 >> 0x37;
      auVar129 = auVar280 >> 0x3f;
      auVar145 = auVar280 >> 0x47;
      auVar161 = auVar280 >> 0x4f;
      auVar177 = auVar280 >> 0x57;
      auVar193 = auVar280 >> 0x5f;
      auVar209 = auVar280 >> 0x67;
      auVar225 = auVar280 >> 0x6f;
      auVar241 = auVar280 >> 0x77;
      bVar258 = auVar280[0xf];
      auVar280 = vpaddb_avx(auVar280,auVar280);
      auVar18 = auVar265 >> 7;
      auVar34 = auVar265 >> 0xf;
      auVar50 = auVar265 >> 0x17;
      auVar66 = auVar265 >> 0x1f;
      auVar82 = auVar265 >> 0x27;
      auVar98 = auVar265 >> 0x2f;
      auVar114 = auVar265 >> 0x37;
      auVar130 = auVar265 >> 0x3f;
      auVar146 = auVar265 >> 0x47;
      auVar162 = auVar265 >> 0x4f;
      auVar178 = auVar265 >> 0x57;
      auVar194 = auVar265 >> 0x5f;
      auVar210 = auVar265 >> 0x67;
      auVar226 = auVar265 >> 0x6f;
      auVar242 = auVar265 >> 0x77;
      bVar259 = auVar265[0xf];
      auVar265 = vpaddb_avx(auVar265,auVar265);
      *(int *)((long)flags + lVar260 + -4) =
           POPCOUNT((uint)(ushort)((ushort)(auVar16[0] & 1) | (ushort)(auVar32[0] & 1) << 1 |
                                   (ushort)(auVar48[0] & 1) << 2 | (ushort)(auVar64[0] & 1) << 3 |
                                   (ushort)(auVar80[0] & 1) << 4 | (ushort)(auVar96[0] & 1) << 5 |
                                   (ushort)(auVar112[0] & 1) << 6 | (ushort)(auVar128[0] & 1) << 7 |
                                   (ushort)(auVar144[0] & 1) << 8 | (ushort)(auVar160[0] & 1) << 9 |
                                   (ushort)(auVar176[0] & 1) << 10 |
                                   (ushort)(auVar192[0] & 1) << 0xb |
                                   (ushort)(auVar208[0] & 1) << 0xc |
                                   (ushort)(auVar224[0] & 1) << 0xd |
                                   (ushort)(auVar240[0] & 1) << 0xe | (ushort)(bVar257 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar17[0] & 1) | (ushort)(auVar33[0] & 1) << 1 |
                                   (ushort)(auVar49[0] & 1) << 2 | (ushort)(auVar65[0] & 1) << 3 |
                                   (ushort)(auVar81[0] & 1) << 4 | (ushort)(auVar97[0] & 1) << 5 |
                                   (ushort)(auVar113[0] & 1) << 6 | (ushort)(auVar129[0] & 1) << 7 |
                                   (ushort)(auVar145[0] & 1) << 8 | (ushort)(auVar161[0] & 1) << 9 |
                                   (ushort)(auVar177[0] & 1) << 10 |
                                   (ushort)(auVar193[0] & 1) << 0xb |
                                   (ushort)(auVar209[0] & 1) << 0xc |
                                   (ushort)(auVar225[0] & 1) << 0xd |
                                   (ushort)(auVar241[0] & 1) << 0xe | (ushort)(bVar258 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar13[0] & 1) | (ushort)(auVar29[0] & 1) << 1 |
                                   (ushort)(auVar45[0] & 1) << 2 | (ushort)(auVar61[0] & 1) << 3 |
                                   (ushort)(auVar77[0] & 1) << 4 | (ushort)(auVar93[0] & 1) << 5 |
                                   (ushort)(auVar109[0] & 1) << 6 | (ushort)(auVar125[0] & 1) << 7 |
                                   (ushort)(auVar141[0] & 1) << 8 | (ushort)(auVar157[0] & 1) << 9 |
                                   (ushort)(auVar173[0] & 1) << 10 |
                                   (ushort)(auVar189[0] & 1) << 0xb |
                                   (ushort)(auVar205[0] & 1) << 0xc |
                                   (ushort)(auVar221[0] & 1) << 0xd |
                                   (ushort)(auVar237[0] & 1) << 0xe | (ushort)(bVar254 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar11[0] & 1) | (ushort)(auVar27[0] & 1) << 1 |
                                   (ushort)(auVar43[0] & 1) << 2 | (ushort)(auVar59[0] & 1) << 3 |
                                   (ushort)(auVar75[0] & 1) << 4 | (ushort)(auVar91[0] & 1) << 5 |
                                   (ushort)(auVar107[0] & 1) << 6 | (ushort)(auVar123[0] & 1) << 7 |
                                   (ushort)(auVar139[0] & 1) << 8 | (ushort)(auVar155[0] & 1) << 9 |
                                   (ushort)(auVar171[0] & 1) << 10 |
                                   (ushort)(auVar187[0] & 1) << 0xb |
                                   (ushort)(auVar203[0] & 1) << 0xc |
                                   (ushort)(auVar219[0] & 1) << 0xd |
                                   (ushort)(auVar235[0] & 1) << 0xe | (ushort)(bVar252 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar9[0] & 1) | (ushort)(auVar25[0] & 1) << 1 |
                                   (ushort)(auVar41[0] & 1) << 2 | (ushort)(auVar57[0] & 1) << 3 |
                                   (ushort)(auVar73[0] & 1) << 4 | (ushort)(auVar89[0] & 1) << 5 |
                                   (ushort)(auVar105[0] & 1) << 6 | (ushort)(auVar121[0] & 1) << 7 |
                                   (ushort)(auVar137[0] & 1) << 8 | (ushort)(auVar153[0] & 1) << 9 |
                                   (ushort)(auVar169[0] & 1) << 10 |
                                   (ushort)(auVar185[0] & 1) << 0xb |
                                   (ushort)(auVar201[0] & 1) << 0xc |
                                   (ushort)(auVar217[0] & 1) << 0xd |
                                   (ushort)(auVar233[0] & 1) << 0xe | (ushort)(bVar250 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar4[0] & 1) | (ushort)(auVar20[0] & 1) << 1 |
                                   (ushort)(auVar36[0] & 1) << 2 | (ushort)(auVar52[0] & 1) << 3 |
                                   (ushort)(auVar68[0] & 1) << 4 | (ushort)(auVar84[0] & 1) << 5 |
                                   (ushort)(auVar100[0] & 1) << 6 | (ushort)(auVar116[0] & 1) << 7 |
                                   (ushort)(auVar132[0] & 1) << 8 | (ushort)(auVar148[0] & 1) << 9 |
                                   (ushort)(auVar164[0] & 1) << 10 |
                                   (ushort)(auVar180[0] & 1) << 0xb |
                                   (ushort)(auVar196[0] & 1) << 0xc |
                                   (ushort)(auVar212[0] & 1) << 0xd |
                                   (ushort)(auVar228[0] & 1) << 0xe | (ushort)(bVar245 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar266[0] & 1) | (ushort)(auVar19[0] & 1) << 1 |
                                   (ushort)(auVar35[0] & 1) << 2 | (ushort)(auVar51[0] & 1) << 3 |
                                   (ushort)(auVar67[0] & 1) << 4 | (ushort)(auVar83[0] & 1) << 5 |
                                   (ushort)(auVar99[0] & 1) << 6 | (ushort)(auVar115[0] & 1) << 7 |
                                   (ushort)(auVar131[0] & 1) << 8 | (ushort)(auVar147[0] & 1) << 9 |
                                   (ushort)(auVar163[0] & 1) << 10 |
                                   (ushort)(auVar179[0] & 1) << 0xb |
                                   (ushort)(auVar195[0] & 1) << 0xc |
                                   (ushort)(auVar211[0] & 1) << 0xd |
                                   (ushort)(auVar227[0] & 1) << 0xe | (ushort)(bVar244 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar6[0] & 1) | (ushort)(auVar22[0] & 1) << 1 |
                                   (ushort)(auVar38[0] & 1) << 2 | (ushort)(auVar54[0] & 1) << 3 |
                                   (ushort)(auVar70[0] & 1) << 4 | (ushort)(auVar86[0] & 1) << 5 |
                                   (ushort)(auVar102[0] & 1) << 6 | (ushort)(auVar118[0] & 1) << 7 |
                                   (ushort)(auVar134[0] & 1) << 8 | (ushort)(auVar150[0] & 1) << 9 |
                                   (ushort)(auVar166[0] & 1) << 10 |
                                   (ushort)(auVar182[0] & 1) << 0xb |
                                   (ushort)(auVar198[0] & 1) << 0xc |
                                   (ushort)(auVar214[0] & 1) << 0xd |
                                   (ushort)(auVar230[0] & 1) << 0xe | (ushort)(bVar247 >> 7) << 0xf)
                   ) + *(int *)((long)flags + lVar260 + -4);
      *(int *)((long)flags + lVar260 + 0x1c) =
           POPCOUNT((uint)(ushort)((ushort)(auVar18[0] & 1) | (ushort)(auVar34[0] & 1) << 1 |
                                   (ushort)(auVar50[0] & 1) << 2 | (ushort)(auVar66[0] & 1) << 3 |
                                   (ushort)(auVar82[0] & 1) << 4 | (ushort)(auVar98[0] & 1) << 5 |
                                   (ushort)(auVar114[0] & 1) << 6 | (ushort)(auVar130[0] & 1) << 7 |
                                   (ushort)(auVar146[0] & 1) << 8 | (ushort)(auVar162[0] & 1) << 9 |
                                   (ushort)(auVar178[0] & 1) << 10 |
                                   (ushort)(auVar194[0] & 1) << 0xb |
                                   (ushort)(auVar210[0] & 1) << 0xc |
                                   (ushort)(auVar226[0] & 1) << 0xd |
                                   (ushort)(auVar242[0] & 1) << 0xe | (ushort)(bVar259 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar14[0] & 1) | (ushort)(auVar30[0] & 1) << 1 |
                                   (ushort)(auVar46[0] & 1) << 2 | (ushort)(auVar62[0] & 1) << 3 |
                                   (ushort)(auVar78[0] & 1) << 4 | (ushort)(auVar94[0] & 1) << 5 |
                                   (ushort)(auVar110[0] & 1) << 6 | (ushort)(auVar126[0] & 1) << 7 |
                                   (ushort)(auVar142[0] & 1) << 8 | (ushort)(auVar158[0] & 1) << 9 |
                                   (ushort)(auVar174[0] & 1) << 10 |
                                   (ushort)(auVar190[0] & 1) << 0xb |
                                   (ushort)(auVar206[0] & 1) << 0xc |
                                   (ushort)(auVar222[0] & 1) << 0xd |
                                   (ushort)(auVar238[0] & 1) << 0xe | (ushort)(bVar255 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar15[0] & 1) | (ushort)(auVar31[0] & 1) << 1 |
                                   (ushort)(auVar47[0] & 1) << 2 | (ushort)(auVar63[0] & 1) << 3 |
                                   (ushort)(auVar79[0] & 1) << 4 | (ushort)(auVar95[0] & 1) << 5 |
                                   (ushort)(auVar111[0] & 1) << 6 | (ushort)(auVar127[0] & 1) << 7 |
                                   (ushort)(auVar143[0] & 1) << 8 | (ushort)(auVar159[0] & 1) << 9 |
                                   (ushort)(auVar175[0] & 1) << 10 |
                                   (ushort)(auVar191[0] & 1) << 0xb |
                                   (ushort)(auVar207[0] & 1) << 0xc |
                                   (ushort)(auVar223[0] & 1) << 0xd |
                                   (ushort)(auVar239[0] & 1) << 0xe | (ushort)(bVar256 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar12[0] & 1) | (ushort)(auVar28[0] & 1) << 1 |
                                   (ushort)(auVar44[0] & 1) << 2 | (ushort)(auVar60[0] & 1) << 3 |
                                   (ushort)(auVar76[0] & 1) << 4 | (ushort)(auVar92[0] & 1) << 5 |
                                   (ushort)(auVar108[0] & 1) << 6 | (ushort)(auVar124[0] & 1) << 7 |
                                   (ushort)(auVar140[0] & 1) << 8 | (ushort)(auVar156[0] & 1) << 9 |
                                   (ushort)(auVar172[0] & 1) << 10 |
                                   (ushort)(auVar188[0] & 1) << 0xb |
                                   (ushort)(auVar204[0] & 1) << 0xc |
                                   (ushort)(auVar220[0] & 1) << 0xd |
                                   (ushort)(auVar236[0] & 1) << 0xe | (ushort)(bVar253 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar10[0] & 1) | (ushort)(auVar26[0] & 1) << 1 |
                                   (ushort)(auVar42[0] & 1) << 2 | (ushort)(auVar58[0] & 1) << 3 |
                                   (ushort)(auVar74[0] & 1) << 4 | (ushort)(auVar90[0] & 1) << 5 |
                                   (ushort)(auVar106[0] & 1) << 6 | (ushort)(auVar122[0] & 1) << 7 |
                                   (ushort)(auVar138[0] & 1) << 8 | (ushort)(auVar154[0] & 1) << 9 |
                                   (ushort)(auVar170[0] & 1) << 10 |
                                   (ushort)(auVar186[0] & 1) << 0xb |
                                   (ushort)(auVar202[0] & 1) << 0xc |
                                   (ushort)(auVar218[0] & 1) << 0xd |
                                   (ushort)(auVar234[0] & 1) << 0xe | (ushort)(bVar251 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar8[0] & 1) | (ushort)(auVar24[0] & 1) << 1 |
                                   (ushort)(auVar40[0] & 1) << 2 | (ushort)(auVar56[0] & 1) << 3 |
                                   (ushort)(auVar72[0] & 1) << 4 | (ushort)(auVar88[0] & 1) << 5 |
                                   (ushort)(auVar104[0] & 1) << 6 | (ushort)(auVar120[0] & 1) << 7 |
                                   (ushort)(auVar136[0] & 1) << 8 | (ushort)(auVar152[0] & 1) << 9 |
                                   (ushort)(auVar168[0] & 1) << 10 |
                                   (ushort)(auVar184[0] & 1) << 0xb |
                                   (ushort)(auVar200[0] & 1) << 0xc |
                                   (ushort)(auVar216[0] & 1) << 0xd |
                                   (ushort)(auVar232[0] & 1) << 0xe | (ushort)(bVar249 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar5[0] & 1) | (ushort)(auVar21[0] & 1) << 1 |
                                   (ushort)(auVar37[0] & 1) << 2 | (ushort)(auVar53[0] & 1) << 3 |
                                   (ushort)(auVar69[0] & 1) << 4 | (ushort)(auVar85[0] & 1) << 5 |
                                   (ushort)(auVar101[0] & 1) << 6 | (ushort)(auVar117[0] & 1) << 7 |
                                   (ushort)(auVar133[0] & 1) << 8 | (ushort)(auVar149[0] & 1) << 9 |
                                   (ushort)(auVar165[0] & 1) << 10 |
                                   (ushort)(auVar181[0] & 1) << 0xb |
                                   (ushort)(auVar197[0] & 1) << 0xc |
                                   (ushort)(auVar213[0] & 1) << 0xd |
                                   (ushort)(auVar229[0] & 1) << 0xe | (ushort)(bVar246 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar7[0] & 1) | (ushort)(auVar23[0] & 1) << 1 |
                                   (ushort)(auVar39[0] & 1) << 2 | (ushort)(auVar55[0] & 1) << 3 |
                                   (ushort)(auVar71[0] & 1) << 4 | (ushort)(auVar87[0] & 1) << 5 |
                                   (ushort)(auVar103[0] & 1) << 6 | (ushort)(auVar119[0] & 1) << 7 |
                                   (ushort)(auVar135[0] & 1) << 8 | (ushort)(auVar151[0] & 1) << 9 |
                                   (ushort)(auVar167[0] & 1) << 10 |
                                   (ushort)(auVar183[0] & 1) << 0xb |
                                   (ushort)(auVar199[0] & 1) << 0xc |
                                   (ushort)(auVar215[0] & 1) << 0xd |
                                   (ushort)(auVar231[0] & 1) << 0xe | (ushort)(bVar248 >> 7) << 0xf)
                   ) + *(int *)((long)flags + lVar260 + 0x1c);
    }
  }
  while (uVar1 = uVar261 + 8, uVar1 <= uVar243) {
    lVar260 = 0x20;
    auVar267 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8),auVar262,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 8));
    auVar270 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 8),auVar263,
                                 *(undefined1 (*) [16])(array + uVar261 * 8));
    auVar271 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x10),auVar262,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x18));
    auVar273 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x18),auVar263,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x10));
    auVar268 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x20),auVar262,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x28));
    auVar274 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x28),auVar263,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x20));
    auVar275 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x30),auVar262,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x38));
    auVar276 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x38),auVar263,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x30));
    for (; uVar261 = uVar1, lVar260 != 0; lVar260 = lVar260 + -4) {
      auVar277 = auVar271 >> 7;
      auVar266 = auVar271 >> 0xf;
      auVar11 = auVar271 >> 0x17;
      auVar19 = auVar271 >> 0x1f;
      auVar27 = auVar271 >> 0x27;
      auVar35 = auVar271 >> 0x2f;
      auVar43 = auVar271 >> 0x37;
      auVar51 = auVar271 >> 0x3f;
      auVar59 = auVar271 >> 0x47;
      auVar67 = auVar271 >> 0x4f;
      auVar75 = auVar271 >> 0x57;
      auVar83 = auVar271 >> 0x5f;
      auVar91 = auVar271 >> 0x67;
      auVar99 = auVar271 >> 0x6f;
      auVar107 = auVar271 >> 0x77;
      bVar244 = auVar271[0xf];
      auVar278 = auVar268 >> 7;
      auVar4 = auVar268 >> 0xf;
      auVar12 = auVar268 >> 0x17;
      auVar20 = auVar268 >> 0x1f;
      auVar28 = auVar268 >> 0x27;
      auVar36 = auVar268 >> 0x2f;
      auVar44 = auVar268 >> 0x37;
      auVar52 = auVar268 >> 0x3f;
      auVar60 = auVar268 >> 0x47;
      auVar68 = auVar268 >> 0x4f;
      auVar76 = auVar268 >> 0x57;
      auVar84 = auVar268 >> 0x5f;
      auVar92 = auVar268 >> 0x67;
      auVar100 = auVar268 >> 0x6f;
      auVar108 = auVar268 >> 0x77;
      bVar245 = auVar268[0xf];
      auVar279 = auVar267 >> 7;
      auVar5 = auVar267 >> 0xf;
      auVar13 = auVar267 >> 0x17;
      auVar21 = auVar267 >> 0x1f;
      auVar29 = auVar267 >> 0x27;
      auVar37 = auVar267 >> 0x2f;
      auVar45 = auVar267 >> 0x37;
      auVar53 = auVar267 >> 0x3f;
      auVar61 = auVar267 >> 0x47;
      auVar69 = auVar267 >> 0x4f;
      auVar77 = auVar267 >> 0x57;
      auVar85 = auVar267 >> 0x5f;
      auVar93 = auVar267 >> 0x67;
      auVar101 = auVar267 >> 0x6f;
      auVar109 = auVar267 >> 0x77;
      bVar246 = auVar267[0xf];
      auVar264 = auVar273 >> 7;
      auVar6 = auVar273 >> 0xf;
      auVar14 = auVar273 >> 0x17;
      auVar22 = auVar273 >> 0x1f;
      auVar30 = auVar273 >> 0x27;
      auVar38 = auVar273 >> 0x2f;
      auVar46 = auVar273 >> 0x37;
      auVar54 = auVar273 >> 0x3f;
      auVar62 = auVar273 >> 0x47;
      auVar70 = auVar273 >> 0x4f;
      auVar78 = auVar273 >> 0x57;
      auVar86 = auVar273 >> 0x5f;
      auVar94 = auVar273 >> 0x67;
      auVar102 = auVar273 >> 0x6f;
      auVar110 = auVar273 >> 0x77;
      bVar247 = auVar273[0xf];
      auVar269 = auVar270 >> 7;
      auVar7 = auVar270 >> 0xf;
      auVar15 = auVar270 >> 0x17;
      auVar23 = auVar270 >> 0x1f;
      auVar31 = auVar270 >> 0x27;
      auVar39 = auVar270 >> 0x2f;
      auVar47 = auVar270 >> 0x37;
      auVar55 = auVar270 >> 0x3f;
      auVar63 = auVar270 >> 0x47;
      auVar71 = auVar270 >> 0x4f;
      auVar79 = auVar270 >> 0x57;
      auVar87 = auVar270 >> 0x5f;
      auVar95 = auVar270 >> 0x67;
      auVar103 = auVar270 >> 0x6f;
      auVar111 = auVar270 >> 0x77;
      bVar248 = auVar270[0xf];
      auVar267 = vpaddb_avx(auVar267,auVar267);
      auVar270 = vpaddb_avx(auVar270,auVar270);
      auVar271 = vpaddb_avx(auVar271,auVar271);
      auVar273 = vpaddb_avx(auVar273,auVar273);
      auVar268 = vpaddb_avx(auVar268,auVar268);
      auVar272 = auVar274 >> 7;
      auVar8 = auVar274 >> 0xf;
      auVar16 = auVar274 >> 0x17;
      auVar24 = auVar274 >> 0x1f;
      auVar32 = auVar274 >> 0x27;
      auVar40 = auVar274 >> 0x2f;
      auVar48 = auVar274 >> 0x37;
      auVar56 = auVar274 >> 0x3f;
      auVar64 = auVar274 >> 0x47;
      auVar72 = auVar274 >> 0x4f;
      auVar80 = auVar274 >> 0x57;
      auVar88 = auVar274 >> 0x5f;
      auVar96 = auVar274 >> 0x67;
      auVar104 = auVar274 >> 0x6f;
      auVar112 = auVar274 >> 0x77;
      bVar249 = auVar274[0xf];
      auVar274 = vpaddb_avx(auVar274,auVar274);
      auVar280 = auVar275 >> 7;
      auVar9 = auVar275 >> 0xf;
      auVar17 = auVar275 >> 0x17;
      auVar25 = auVar275 >> 0x1f;
      auVar33 = auVar275 >> 0x27;
      auVar41 = auVar275 >> 0x2f;
      auVar49 = auVar275 >> 0x37;
      auVar57 = auVar275 >> 0x3f;
      auVar65 = auVar275 >> 0x47;
      auVar73 = auVar275 >> 0x4f;
      auVar81 = auVar275 >> 0x57;
      auVar89 = auVar275 >> 0x5f;
      auVar97 = auVar275 >> 0x67;
      auVar105 = auVar275 >> 0x6f;
      auVar113 = auVar275 >> 0x77;
      bVar250 = auVar275[0xf];
      auVar275 = vpaddb_avx(auVar275,auVar275);
      auVar265 = auVar276 >> 7;
      auVar10 = auVar276 >> 0xf;
      auVar18 = auVar276 >> 0x17;
      auVar26 = auVar276 >> 0x1f;
      auVar34 = auVar276 >> 0x27;
      auVar42 = auVar276 >> 0x2f;
      auVar50 = auVar276 >> 0x37;
      auVar58 = auVar276 >> 0x3f;
      auVar66 = auVar276 >> 0x47;
      auVar74 = auVar276 >> 0x4f;
      auVar82 = auVar276 >> 0x57;
      auVar90 = auVar276 >> 0x5f;
      auVar98 = auVar276 >> 0x67;
      auVar106 = auVar276 >> 0x6f;
      auVar114 = auVar276 >> 0x77;
      bVar251 = auVar276[0xf];
      auVar276 = vpaddb_avx(auVar276,auVar276);
      *(int *)((long)flags + lVar260 + -4) =
           POPCOUNT((uint)(ushort)((ushort)(auVar280[0] & 1) | (ushort)(auVar9[0] & 1) << 1 |
                                   (ushort)(auVar17[0] & 1) << 2 | (ushort)(auVar25[0] & 1) << 3 |
                                   (ushort)(auVar33[0] & 1) << 4 | (ushort)(auVar41[0] & 1) << 5 |
                                   (ushort)(auVar49[0] & 1) << 6 | (ushort)(auVar57[0] & 1) << 7 |
                                   (ushort)(auVar65[0] & 1) << 8 | (ushort)(auVar73[0] & 1) << 9 |
                                   (ushort)(auVar81[0] & 1) << 10 | (ushort)(auVar89[0] & 1) << 0xb
                                   | (ushort)(auVar97[0] & 1) << 0xc |
                                   (ushort)(auVar105[0] & 1) << 0xd |
                                   (ushort)(auVar113[0] & 1) << 0xe | (ushort)(bVar250 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar278[0] & 1) | (ushort)(auVar4[0] & 1) << 1 |
                                   (ushort)(auVar12[0] & 1) << 2 | (ushort)(auVar20[0] & 1) << 3 |
                                   (ushort)(auVar28[0] & 1) << 4 | (ushort)(auVar36[0] & 1) << 5 |
                                   (ushort)(auVar44[0] & 1) << 6 | (ushort)(auVar52[0] & 1) << 7 |
                                   (ushort)(auVar60[0] & 1) << 8 | (ushort)(auVar68[0] & 1) << 9 |
                                   (ushort)(auVar76[0] & 1) << 10 | (ushort)(auVar84[0] & 1) << 0xb
                                   | (ushort)(auVar92[0] & 1) << 0xc |
                                   (ushort)(auVar100[0] & 1) << 0xd |
                                   (ushort)(auVar108[0] & 1) << 0xe | (ushort)(bVar245 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar277[0] & 1) | (ushort)(auVar266[0] & 1) << 1 |
                                   (ushort)(auVar11[0] & 1) << 2 | (ushort)(auVar19[0] & 1) << 3 |
                                   (ushort)(auVar27[0] & 1) << 4 | (ushort)(auVar35[0] & 1) << 5 |
                                   (ushort)(auVar43[0] & 1) << 6 | (ushort)(auVar51[0] & 1) << 7 |
                                   (ushort)(auVar59[0] & 1) << 8 | (ushort)(auVar67[0] & 1) << 9 |
                                   (ushort)(auVar75[0] & 1) << 10 | (ushort)(auVar83[0] & 1) << 0xb
                                   | (ushort)(auVar91[0] & 1) << 0xc |
                                   (ushort)(auVar99[0] & 1) << 0xd |
                                   (ushort)(auVar107[0] & 1) << 0xe | (ushort)(bVar244 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar279[0] & 1) | (ushort)(auVar5[0] & 1) << 1 |
                                   (ushort)(auVar13[0] & 1) << 2 | (ushort)(auVar21[0] & 1) << 3 |
                                   (ushort)(auVar29[0] & 1) << 4 | (ushort)(auVar37[0] & 1) << 5 |
                                   (ushort)(auVar45[0] & 1) << 6 | (ushort)(auVar53[0] & 1) << 7 |
                                   (ushort)(auVar61[0] & 1) << 8 | (ushort)(auVar69[0] & 1) << 9 |
                                   (ushort)(auVar77[0] & 1) << 10 | (ushort)(auVar85[0] & 1) << 0xb
                                   | (ushort)(auVar93[0] & 1) << 0xc |
                                   (ushort)(auVar101[0] & 1) << 0xd |
                                   (ushort)(auVar109[0] & 1) << 0xe | (ushort)(bVar246 >> 7) << 0xf)
                   ) + *(int *)((long)flags + lVar260 + -4);
      *(int *)((long)flags + lVar260 + 0x1c) =
           POPCOUNT((uint)(ushort)((ushort)(auVar265[0] & 1) | (ushort)(auVar10[0] & 1) << 1 |
                                   (ushort)(auVar18[0] & 1) << 2 | (ushort)(auVar26[0] & 1) << 3 |
                                   (ushort)(auVar34[0] & 1) << 4 | (ushort)(auVar42[0] & 1) << 5 |
                                   (ushort)(auVar50[0] & 1) << 6 | (ushort)(auVar58[0] & 1) << 7 |
                                   (ushort)(auVar66[0] & 1) << 8 | (ushort)(auVar74[0] & 1) << 9 |
                                   (ushort)(auVar82[0] & 1) << 10 | (ushort)(auVar90[0] & 1) << 0xb
                                   | (ushort)(auVar98[0] & 1) << 0xc |
                                   (ushort)(auVar106[0] & 1) << 0xd |
                                   (ushort)(auVar114[0] & 1) << 0xe | (ushort)(bVar251 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar272[0] & 1) | (ushort)(auVar8[0] & 1) << 1 |
                                   (ushort)(auVar16[0] & 1) << 2 | (ushort)(auVar24[0] & 1) << 3 |
                                   (ushort)(auVar32[0] & 1) << 4 | (ushort)(auVar40[0] & 1) << 5 |
                                   (ushort)(auVar48[0] & 1) << 6 | (ushort)(auVar56[0] & 1) << 7 |
                                   (ushort)(auVar64[0] & 1) << 8 | (ushort)(auVar72[0] & 1) << 9 |
                                   (ushort)(auVar80[0] & 1) << 10 | (ushort)(auVar88[0] & 1) << 0xb
                                   | (ushort)(auVar96[0] & 1) << 0xc |
                                   (ushort)(auVar104[0] & 1) << 0xd |
                                   (ushort)(auVar112[0] & 1) << 0xe | (ushort)(bVar249 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar264[0] & 1) | (ushort)(auVar6[0] & 1) << 1 |
                                   (ushort)(auVar14[0] & 1) << 2 | (ushort)(auVar22[0] & 1) << 3 |
                                   (ushort)(auVar30[0] & 1) << 4 | (ushort)(auVar38[0] & 1) << 5 |
                                   (ushort)(auVar46[0] & 1) << 6 | (ushort)(auVar54[0] & 1) << 7 |
                                   (ushort)(auVar62[0] & 1) << 8 | (ushort)(auVar70[0] & 1) << 9 |
                                   (ushort)(auVar78[0] & 1) << 10 | (ushort)(auVar86[0] & 1) << 0xb
                                   | (ushort)(auVar94[0] & 1) << 0xc |
                                   (ushort)(auVar102[0] & 1) << 0xd |
                                   (ushort)(auVar110[0] & 1) << 0xe | (ushort)(bVar247 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar269[0] & 1) | (ushort)(auVar7[0] & 1) << 1 |
                                   (ushort)(auVar15[0] & 1) << 2 | (ushort)(auVar23[0] & 1) << 3 |
                                   (ushort)(auVar31[0] & 1) << 4 | (ushort)(auVar39[0] & 1) << 5 |
                                   (ushort)(auVar47[0] & 1) << 6 | (ushort)(auVar55[0] & 1) << 7 |
                                   (ushort)(auVar63[0] & 1) << 8 | (ushort)(auVar71[0] & 1) << 9 |
                                   (ushort)(auVar79[0] & 1) << 10 | (ushort)(auVar87[0] & 1) << 0xb
                                   | (ushort)(auVar95[0] & 1) << 0xc |
                                   (ushort)(auVar103[0] & 1) << 0xd |
                                   (ushort)(auVar111[0] & 1) << 0xe | (ushort)(bVar248 >> 7) << 0xf)
                   ) + *(int *)((long)flags + lVar260 + 0x1c);
    }
  }
  while (uVar1 = uVar261 + 4, uVar1 <= uVar243) {
    lVar260 = 0x20;
    auVar267 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8),auVar262,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 8));
    auVar270 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 8),auVar263,
                                 *(undefined1 (*) [16])(array + uVar261 * 8));
    auVar271 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x10),auVar262,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x18));
    auVar273 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 0x18),auVar263,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 0x10));
    for (; uVar261 = uVar1, lVar260 != 0; lVar260 = lVar260 + -4) {
      auVar268 = auVar267 >> 7;
      auVar277 = auVar267 >> 0xf;
      auVar269 = auVar267 >> 0x17;
      auVar266 = auVar267 >> 0x1f;
      auVar7 = auVar267 >> 0x27;
      auVar11 = auVar267 >> 0x2f;
      auVar15 = auVar267 >> 0x37;
      auVar19 = auVar267 >> 0x3f;
      auVar23 = auVar267 >> 0x47;
      auVar27 = auVar267 >> 0x4f;
      auVar31 = auVar267 >> 0x57;
      auVar35 = auVar267 >> 0x5f;
      auVar39 = auVar267 >> 0x67;
      auVar43 = auVar267 >> 0x6f;
      auVar47 = auVar267 >> 0x77;
      bVar244 = auVar267[0xf];
      auVar274 = auVar270 >> 7;
      auVar278 = auVar270 >> 0xf;
      auVar272 = auVar270 >> 0x17;
      auVar4 = auVar270 >> 0x1f;
      auVar8 = auVar270 >> 0x27;
      auVar12 = auVar270 >> 0x2f;
      auVar16 = auVar270 >> 0x37;
      auVar20 = auVar270 >> 0x3f;
      auVar24 = auVar270 >> 0x47;
      auVar28 = auVar270 >> 0x4f;
      auVar32 = auVar270 >> 0x57;
      auVar36 = auVar270 >> 0x5f;
      auVar40 = auVar270 >> 0x67;
      auVar44 = auVar270 >> 0x6f;
      auVar48 = auVar270 >> 0x77;
      bVar245 = auVar270[0xf];
      auVar275 = auVar271 >> 7;
      auVar279 = auVar271 >> 0xf;
      auVar280 = auVar271 >> 0x17;
      auVar5 = auVar271 >> 0x1f;
      auVar9 = auVar271 >> 0x27;
      auVar13 = auVar271 >> 0x2f;
      auVar17 = auVar271 >> 0x37;
      auVar21 = auVar271 >> 0x3f;
      auVar25 = auVar271 >> 0x47;
      auVar29 = auVar271 >> 0x4f;
      auVar33 = auVar271 >> 0x57;
      auVar37 = auVar271 >> 0x5f;
      auVar41 = auVar271 >> 0x67;
      auVar45 = auVar271 >> 0x6f;
      auVar49 = auVar271 >> 0x77;
      bVar246 = auVar271[0xf];
      auVar267 = vpaddb_avx(auVar267,auVar267);
      auVar270 = vpaddb_avx(auVar270,auVar270);
      auVar271 = vpaddb_avx(auVar271,auVar271);
      auVar276 = auVar273 >> 7;
      auVar264 = auVar273 >> 0xf;
      auVar265 = auVar273 >> 0x17;
      auVar6 = auVar273 >> 0x1f;
      auVar10 = auVar273 >> 0x27;
      auVar14 = auVar273 >> 0x2f;
      auVar18 = auVar273 >> 0x37;
      auVar22 = auVar273 >> 0x3f;
      auVar26 = auVar273 >> 0x47;
      auVar30 = auVar273 >> 0x4f;
      auVar34 = auVar273 >> 0x57;
      auVar38 = auVar273 >> 0x5f;
      auVar42 = auVar273 >> 0x67;
      auVar46 = auVar273 >> 0x6f;
      auVar50 = auVar273 >> 0x77;
      bVar247 = auVar273[0xf];
      auVar273 = vpaddb_avx(auVar273,auVar273);
      *(int *)((long)flags + lVar260 + -4) =
           POPCOUNT((uint)(ushort)((ushort)(auVar275[0] & 1) | (ushort)(auVar279[0] & 1) << 1 |
                                   (ushort)(auVar280[0] & 1) << 2 | (ushort)(auVar5[0] & 1) << 3 |
                                   (ushort)(auVar9[0] & 1) << 4 | (ushort)(auVar13[0] & 1) << 5 |
                                   (ushort)(auVar17[0] & 1) << 6 | (ushort)(auVar21[0] & 1) << 7 |
                                   (ushort)(auVar25[0] & 1) << 8 | (ushort)(auVar29[0] & 1) << 9 |
                                   (ushort)(auVar33[0] & 1) << 10 | (ushort)(auVar37[0] & 1) << 0xb
                                   | (ushort)(auVar41[0] & 1) << 0xc |
                                   (ushort)(auVar45[0] & 1) << 0xd | (ushort)(auVar49[0] & 1) << 0xe
                                  | (ushort)(bVar246 >> 7) << 0xf)) +
           POPCOUNT((uint)(ushort)((ushort)(auVar268[0] & 1) | (ushort)(auVar277[0] & 1) << 1 |
                                   (ushort)(auVar269[0] & 1) << 2 | (ushort)(auVar266[0] & 1) << 3 |
                                   (ushort)(auVar7[0] & 1) << 4 | (ushort)(auVar11[0] & 1) << 5 |
                                   (ushort)(auVar15[0] & 1) << 6 | (ushort)(auVar19[0] & 1) << 7 |
                                   (ushort)(auVar23[0] & 1) << 8 | (ushort)(auVar27[0] & 1) << 9 |
                                   (ushort)(auVar31[0] & 1) << 10 | (ushort)(auVar35[0] & 1) << 0xb
                                   | (ushort)(auVar39[0] & 1) << 0xc |
                                   (ushort)(auVar43[0] & 1) << 0xd | (ushort)(auVar47[0] & 1) << 0xe
                                  | (ushort)(bVar244 >> 7) << 0xf)) +
           *(int *)((long)flags + lVar260 + -4);
      *(int *)((long)flags + lVar260 + 0x1c) =
           POPCOUNT((uint)(ushort)((ushort)(auVar276[0] & 1) | (ushort)(auVar264[0] & 1) << 1 |
                                   (ushort)(auVar265[0] & 1) << 2 | (ushort)(auVar6[0] & 1) << 3 |
                                   (ushort)(auVar10[0] & 1) << 4 | (ushort)(auVar14[0] & 1) << 5 |
                                   (ushort)(auVar18[0] & 1) << 6 | (ushort)(auVar22[0] & 1) << 7 |
                                   (ushort)(auVar26[0] & 1) << 8 | (ushort)(auVar30[0] & 1) << 9 |
                                   (ushort)(auVar34[0] & 1) << 10 | (ushort)(auVar38[0] & 1) << 0xb
                                   | (ushort)(auVar42[0] & 1) << 0xc |
                                   (ushort)(auVar46[0] & 1) << 0xd | (ushort)(auVar50[0] & 1) << 0xe
                                  | (ushort)(bVar247 >> 7) << 0xf)) +
           POPCOUNT((uint)(ushort)((ushort)(auVar274[0] & 1) | (ushort)(auVar278[0] & 1) << 1 |
                                   (ushort)(auVar272[0] & 1) << 2 | (ushort)(auVar4[0] & 1) << 3 |
                                   (ushort)(auVar8[0] & 1) << 4 | (ushort)(auVar12[0] & 1) << 5 |
                                   (ushort)(auVar16[0] & 1) << 6 | (ushort)(auVar20[0] & 1) << 7 |
                                   (ushort)(auVar24[0] & 1) << 8 | (ushort)(auVar28[0] & 1) << 9 |
                                   (ushort)(auVar32[0] & 1) << 10 | (ushort)(auVar36[0] & 1) << 0xb
                                   | (ushort)(auVar40[0] & 1) << 0xc |
                                   (ushort)(auVar44[0] & 1) << 0xd | (ushort)(auVar48[0] & 1) << 0xe
                                  | (ushort)(bVar245 >> 7) << 0xf)) +
           *(int *)((long)flags + lVar260 + 0x1c);
    }
  }
  while (uVar1 = uVar261 + 2, uVar1 <= uVar243) {
    lVar260 = 0x20;
    auVar267 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8),auVar262,
                                 *(undefined1 (*) [16])(array + uVar261 * 8 + 8));
    auVar270 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar261 * 8 + 8),auVar263,
                                 *(undefined1 (*) [16])(array + uVar261 * 8));
    for (; uVar261 = uVar1, lVar260 != 0; lVar260 = lVar260 + -4) {
      auVar271 = auVar267 >> 7;
      auVar273 = auVar267 >> 0xf;
      auVar268 = auVar267 >> 0x17;
      auVar274 = auVar267 >> 0x1f;
      auVar275 = auVar267 >> 0x27;
      auVar276 = auVar267 >> 0x2f;
      auVar277 = auVar267 >> 0x37;
      auVar278 = auVar267 >> 0x3f;
      auVar279 = auVar267 >> 0x47;
      auVar264 = auVar267 >> 0x4f;
      auVar269 = auVar267 >> 0x57;
      auVar272 = auVar267 >> 0x5f;
      auVar280 = auVar267 >> 0x67;
      auVar265 = auVar267 >> 0x6f;
      auVar266 = auVar267 >> 0x77;
      bVar244 = auVar267[0xf];
      auVar267 = vpaddb_avx(auVar267,auVar267);
      piVar2 = (int *)((long)flags + lVar260 + -4);
      *piVar2 = *piVar2 + POPCOUNT((uint)(ushort)((ushort)(auVar271[0] & 1) |
                                                  (ushort)(auVar273[0] & 1) << 1 |
                                                  (ushort)(auVar268[0] & 1) << 2 |
                                                  (ushort)(auVar274[0] & 1) << 3 |
                                                  (ushort)(auVar275[0] & 1) << 4 |
                                                  (ushort)(auVar276[0] & 1) << 5 |
                                                  (ushort)(auVar277[0] & 1) << 6 |
                                                  (ushort)(auVar278[0] & 1) << 7 |
                                                  (ushort)(auVar279[0] & 1) << 8 |
                                                  (ushort)(auVar264[0] & 1) << 9 |
                                                  (ushort)(auVar269[0] & 1) << 10 |
                                                  (ushort)(auVar272[0] & 1) << 0xb |
                                                  (ushort)(auVar280[0] & 1) << 0xc |
                                                  (ushort)(auVar265[0] & 1) << 0xd |
                                                  (ushort)(auVar266[0] & 1) << 0xe |
                                                 (ushort)(bVar244 >> 7) << 0xf));
      auVar271 = auVar270 >> 7;
      auVar273 = auVar270 >> 0xf;
      auVar268 = auVar270 >> 0x17;
      auVar274 = auVar270 >> 0x1f;
      auVar275 = auVar270 >> 0x27;
      auVar276 = auVar270 >> 0x2f;
      auVar277 = auVar270 >> 0x37;
      auVar278 = auVar270 >> 0x3f;
      auVar279 = auVar270 >> 0x47;
      auVar264 = auVar270 >> 0x4f;
      auVar269 = auVar270 >> 0x57;
      auVar272 = auVar270 >> 0x5f;
      auVar280 = auVar270 >> 0x67;
      auVar265 = auVar270 >> 0x6f;
      auVar266 = auVar270 >> 0x77;
      bVar244 = auVar270[0xf];
      auVar270 = vpaddb_avx(auVar270,auVar270);
      piVar2 = (int *)((long)flags + lVar260 + 0x1c);
      *piVar2 = *piVar2 + POPCOUNT((uint)(ushort)((ushort)(auVar271[0] & 1) |
                                                  (ushort)(auVar273[0] & 1) << 1 |
                                                  (ushort)(auVar268[0] & 1) << 2 |
                                                  (ushort)(auVar274[0] & 1) << 3 |
                                                  (ushort)(auVar275[0] & 1) << 4 |
                                                  (ushort)(auVar276[0] & 1) << 5 |
                                                  (ushort)(auVar277[0] & 1) << 6 |
                                                  (ushort)(auVar278[0] & 1) << 7 |
                                                  (ushort)(auVar279[0] & 1) << 8 |
                                                  (ushort)(auVar264[0] & 1) << 9 |
                                                  (ushort)(auVar269[0] & 1) << 10 |
                                                  (ushort)(auVar272[0] & 1) << 0xb |
                                                  (ushort)(auVar280[0] & 1) << 0xc |
                                                  (ushort)(auVar265[0] & 1) << 0xd |
                                                  (ushort)(auVar266[0] & 1) << 0xe |
                                                 (ushort)(bVar244 >> 7) << 0xf));
    }
  }
  for (uVar261 = uVar261 << 3; uVar261 < len; uVar261 = uVar261 + 1) {
    uVar3 = array[uVar261];
    for (lVar260 = 0; lVar260 != 0x10; lVar260 = lVar260 + 1) {
      flags[lVar260] = flags[lVar260] + (uint)((uVar3 >> ((uint)lVar260 & 0x1f) & 1) != 0);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_blend_popcnt_unroll16(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m128i* data_vectors = (const __m128i*)(array);
    const uint32_t n_cycles = len / 8;

    size_t i = 0;
    for (/**/; i + 16 <= n_cycles; i += 16) {
#define L(p) __m128i v##p = _mm_loadu_si128(data_vectors+i+p);
        L(0)  L(1)  L(2)  L(3)  
        L(4)  L(5)  L(6)  L(7) 
        L(8)  L(9)  L(10) L(11) 
        L(12) L(13) L(14) L(15)

#define U0(p,k) __m128i input##p = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16(0x00FF)), _mm_slli_epi16(v##k, 8));
#define U1(p,k) __m128i input##k = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16((int16_t)0xFF00)), _mm_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)

        U(0,1) U( 2, 3) U( 4, 5) U( 6, 7)
        U(8,9) U(10,11) U(12,13) U(14,15)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A( 2,  3) A( 4, 5) A( 6,  7)
            A(8,9) A(10, 11) A(12,13) A(14, 15)

#define P0(p) input##p = _mm_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P( 2,  3) P( 4, 5) P( 6,  7)
            P(8,9) P(10, 11) P(12,13) P(14, 15)
        }
    }

    for (/**/; i + 8 <= n_cycles; i += 8) {
        L(0) L(1) L(2) L(3)
        L(4) L(5) L(6) L(7)

        U(0,1) U(2,3) U(4,5) U(6,7)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A(2, 3) A(4,5) A(6, 7)
            P(0,1) P(2, 3) P(4,5) P(6, 7)
        }
    }

    for (/**/; i + 4 <= n_cycles; i += 4) {
        L(0) L(1) L(2) L(3)
        U(0,1) U(2,3)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A(2, 3)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 8;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P
    
    return 0;
}